

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_writer.cpp
# Opt level: O1

string * __thiscall
Json::valueToString_abi_cxx11_(string *__return_storage_ptr__,Json *this,double value)

{
  size_t sVar1;
  char buffer [32];
  char acStack_38 [40];
  
  snprintf(acStack_38,0x20,"%.16g");
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  sVar1 = strlen(acStack_38);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,acStack_38,acStack_38 + sVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string valueToString( double value )
{
    // Allocate a buffer that is more than large enough to store the 16 digits of
    // precision requested below.
    char buffer[32];
    // Print into the buffer. We need not request the alternative representation
    // that always has a decimal point because JSON doesn't distingish the
    // concepts of reals and integers.
#if defined(_MSC_VER) && defined(__STDC_SECURE_LIB__) // Use secure version with visual studio 2005 to avoid warning.
    sprintf_s(buffer, sizeof(buffer), "%.16g", value);
#else
    snprintf(buffer, sizeof(buffer), "%.16g", value);
#endif
    return buffer;
}